

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int flagPragma(Parse *pParse,char *zLeft,char *zRight)

{
  byte bVar1;
  byte *zLabel;
  sqlite3 *psVar2;
  uint uVar3;
  byte *pbVar4;
  u8 uVar5;
  Vdbe *p;
  int iVar6;
  byte *pbVar7;
  ulong uVar8;
  sPragmaType *psVar9;
  
  psVar9 = flagPragma::aPragma;
  iVar6 = 0;
  do {
    zLabel = (byte *)psVar9->zName;
    bVar1 = *zLeft;
    pbVar4 = (byte *)(zLeft + 1);
    pbVar7 = zLabel;
    while (bVar1 != 0) {
      uVar8 = (ulong)bVar1;
      if (""[uVar8] != ""[*pbVar7]) goto LAB_0019e5cb;
      pbVar7 = pbVar7 + 1;
      bVar1 = *pbVar4;
      pbVar4 = pbVar4 + 1;
    }
    uVar8 = 0;
LAB_0019e5cb:
    if (""[uVar8] == ""[*pbVar7]) {
      psVar2 = pParse->db;
      p = sqlite3GetVdbe(pParse);
      if (p == (Vdbe *)0x0) {
        return 1;
      }
      if (zRight != (char *)0x0) {
        uVar3 = psVar9->mask & 0xfffbffff;
        if (psVar2->autoCommit != '\0') {
          uVar3 = psVar9->mask;
        }
        uVar5 = getSafetyLevel(zRight,1,0);
        if (uVar5 == '\0') {
          psVar2->flags = psVar2->flags & ~uVar3;
        }
        else {
          psVar2->flags = psVar2->flags | uVar3;
        }
        sqlite3VdbeAddOp3(p,0x81,0,0,0);
        return 1;
      }
      returnSingleInt(pParse,(char *)zLabel,(ulong)((psVar2->flags & psVar9->mask) != 0));
      return 1;
    }
    iVar6 = iVar6 + 1;
    psVar9 = psVar9 + 1;
    if (iVar6 == 0xe) {
      return 0;
    }
  } while( true );
}

Assistant:

static int flagPragma(Parse *pParse, const char *zLeft, const char *zRight){
  static const struct sPragmaType {
    const char *zName;  /* Name of the pragma */
    int mask;           /* Mask for the db->flags value */
  } aPragma[] = {
    { "full_column_names",        SQLITE_FullColNames  },
    { "short_column_names",       SQLITE_ShortColNames },
    { "count_changes",            SQLITE_CountRows     },
    { "empty_result_callbacks",   SQLITE_NullCallback  },
    { "legacy_file_format",       SQLITE_LegacyFileFmt },
    { "fullfsync",                SQLITE_FullFSync     },
    { "checkpoint_fullfsync",     SQLITE_CkptFullFSync },
    { "reverse_unordered_selects", SQLITE_ReverseOrder  },
#ifndef SQLITE_OMIT_AUTOMATIC_INDEX
    { "automatic_index",          SQLITE_AutoIndex     },
#endif
#ifdef SQLITE_DEBUG
    { "sql_trace",                SQLITE_SqlTrace      },
    { "vdbe_listing",             SQLITE_VdbeListing   },
    { "vdbe_trace",               SQLITE_VdbeTrace     },
    { "vdbe_addoptrace",          SQLITE_VdbeAddopTrace},
    { "vdbe_debug",    SQLITE_SqlTrace | SQLITE_VdbeListing
                               | SQLITE_VdbeTrace      },
#endif
#ifndef SQLITE_OMIT_CHECK
    { "ignore_check_constraints", SQLITE_IgnoreChecks  },
#endif
    /* The following is VERY experimental */
    { "writable_schema",          SQLITE_WriteSchema|SQLITE_RecoveryMode },

    /* TODO: Maybe it shouldn't be possible to change the ReadUncommitted
    ** flag if there are any active statements. */
    { "read_uncommitted",         SQLITE_ReadUncommitted },
    { "recursive_triggers",       SQLITE_RecTriggers },

    /* This flag may only be set if both foreign-key and trigger support
    ** are present in the build.  */
#if !defined(SQLITE_OMIT_FOREIGN_KEY) && !defined(SQLITE_OMIT_TRIGGER)
    { "foreign_keys",             SQLITE_ForeignKeys },
#endif
  };
  int i;
  const struct sPragmaType *p;
  for(i=0, p=aPragma; i<ArraySize(aPragma); i++, p++){
    if( sqlite3StrICmp(zLeft, p->zName)==0 ){
      sqlite3 *db = pParse->db;
      Vdbe *v;
      v = sqlite3GetVdbe(pParse);
      assert( v!=0 );  /* Already allocated by sqlite3Pragma() */
      if( ALWAYS(v) ){
        if( zRight==0 ){
          returnSingleInt(pParse, p->zName, (db->flags & p->mask)!=0 );
        }else{
          int mask = p->mask;          /* Mask of bits to set or clear. */
          if( db->autoCommit==0 ){
            /* Foreign key support may not be enabled or disabled while not
            ** in auto-commit mode.  */
            mask &= ~(SQLITE_ForeignKeys);
          }

          if( sqlite3GetBoolean(zRight, 0) ){
            db->flags |= mask;
          }else{
            db->flags &= ~mask;
          }

          /* Many of the flag-pragmas modify the code generated by the SQL 
          ** compiler (eg. count_changes). So add an opcode to expire all
          ** compiled SQL statements after modifying a pragma value.
          */
          sqlite3VdbeAddOp2(v, OP_Expire, 0, 0);
        }
      }

      return 1;
    }
  }
  return 0;
}